

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SRUP_Crypto.cpp
# Opt level: O2

RSA * SRUP_Crypto::getPubKeyF(char *keyfile)

{
  FILE *fp;
  RSA *key;
  RSA *local_18;
  
  fp = fopen(keyfile,"rb");
  if (fp == (FILE *)0x0) {
    local_18 = (RSA *)0x0;
  }
  else {
    local_18 = RSA_new();
    local_18 = PEM_read_RSA_PUBKEY(fp,&local_18,(undefined1 *)0x0,(void *)0x0);
    fclose(fp);
  }
  return (RSA *)local_18;
}

Assistant:

RSA* SRUP_Crypto::getPubKeyF(char *keyfile)
{
    RSA *key;
    FILE *fp = fopen(keyfile, "rb");
    if (!fp)
        return nullptr;
    else
    {
        key = RSA_new();
        key = PEM_read_RSA_PUBKEY(fp, &key, nullptr, nullptr);
        fclose(fp);
        return key;
    }
}